

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpnetworkconnection.cpp
# Opt level: O2

void __thiscall
QHttpNetworkConnectionPrivate::startHostInfoLookup(QHttpNetworkConnectionPrivate *this)

{
  Data *pDVar1;
  bool bVar2;
  Capabilities CVar3;
  NetworkLayerProtocol NVar4;
  QNetworkProxy *this_00;
  long in_FS_OFFSET;
  QHostInfo hostInfo;
  bool immediateResultValid;
  int hostLookupId;
  QHostAddress temp;
  char16_t *pcStack_50;
  qsizetype local_48;
  QArrayDataPointer<char16_t> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this->networkLayerState = HostLookupPending;
  local_38.d = (this->hostName).d.d;
  local_38.ptr = (this->hostName).d.ptr;
  local_38.size = (this->hostName).d.size;
  if ((QHostAddressPrivate *)local_38.d != (QHostAddressPrivate *)0x0) {
    LOCK();
    (((QArrayData *)&((QHostAddressPrivate *)local_38.d)->super_QSharedData)->ref_)._q_value.
    super___atomic_base<int>._M_i =
         (((QArrayData *)&((QHostAddressPrivate *)local_38.d)->super_QSharedData)->ref_)._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  this_00 = &this->networkProxy;
  CVar3 = QNetworkProxy::capabilities(this_00);
  if (((uint)CVar3.super_QFlagsStorageHelper<QNetworkProxy::Capability,_4>.
             super_QFlagsStorage<QNetworkProxy::Capability>.i & 0x10) == 0) {
    CVar3 = QNetworkProxy::capabilities(&this->channels->proxy);
    if (((uint)CVar3.super_QFlagsStorageHelper<QNetworkProxy::Capability,_4>.
               super_QFlagsStorage<QNetworkProxy::Capability>.i & 0x10) != 0) {
      this_00 = &this->channels->proxy;
      goto LAB_001ebb8a;
    }
  }
  else {
LAB_001ebb8a:
    QNetworkProxy::hostName((QString *)&temp,this_00);
    pDVar1 = local_38.d;
    local_38.d = (Data *)temp.d.d.ptr;
    local_38.ptr = pcStack_50;
    temp.d.d.ptr = (QExplicitlySharedDataPointer<QHostAddressPrivate>)
                   (QExplicitlySharedDataPointer<QHostAddressPrivate>)pDVar1;
    local_38.size = local_48;
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&temp);
  }
  temp.d.d.ptr = (QExplicitlySharedDataPointer<QHostAddressPrivate>)&DAT_aaaaaaaaaaaaaaaa;
  QHostAddress::QHostAddress(&temp);
  bVar2 = QHostAddress::setAddress(&temp,(QString *)&local_38);
  if (bVar2) {
    NVar4 = QHostAddress::protocol(&temp);
    if (NVar4 == IPv6Protocol) {
      this->networkLayerState = IPv6;
    }
    else {
      if (NVar4 != IPv4Protocol) goto LAB_001ebc75;
      this->networkLayerState = IPv4;
    }
    QMetaObject::invokeMethod<>
              (*(QObject **)&this->field_0x8,"_q_startNextRequest",QueuedConnection);
  }
  else {
    hostLookupId = -0x55555556;
    immediateResultValid = false;
    hostInfo.d_ptr = (QHostInfoPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    qt_qhostinfo_lookup((QString *)&hostInfo,(QObject *)&local_38,*(char **)&this->field_0x8,
                        (bool *)"1_q_hostLookupFinished(QHostInfo)",(int *)&immediateResultValid);
    if (immediateResultValid == true) {
      _q_hostLookupFinished(this,&hostInfo);
    }
    QHostInfo::~QHostInfo(&hostInfo);
  }
LAB_001ebc75:
  QHostAddress::~QHostAddress(&temp);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QHttpNetworkConnectionPrivate::startHostInfoLookup()
{
    networkLayerState = HostLookupPending;

    // check if we already now can decide if this is IPv4 or IPv6
    QString lookupHost = hostName;
#ifndef QT_NO_NETWORKPROXY
    if (networkProxy.capabilities() & QNetworkProxy::HostNameLookupCapability) {
        lookupHost = networkProxy.hostName();
    } else if (channels[0].proxy.capabilities() & QNetworkProxy::HostNameLookupCapability) {
        lookupHost = channels[0].proxy.hostName();
    }
#endif
    QHostAddress temp;
    if (temp.setAddress(lookupHost)) {
        const QAbstractSocket::NetworkLayerProtocol protocol = temp.protocol();
        if (protocol == QAbstractSocket::IPv4Protocol) {
            networkLayerState = QHttpNetworkConnectionPrivate::IPv4;
            QMetaObject::invokeMethod(this->q_func(), "_q_startNextRequest", Qt::QueuedConnection);
            return;
        } else if (protocol == QAbstractSocket::IPv6Protocol) {
            networkLayerState = QHttpNetworkConnectionPrivate::IPv6;
            QMetaObject::invokeMethod(this->q_func(), "_q_startNextRequest", Qt::QueuedConnection);
            return;
        }
    } else {
        int hostLookupId;
        bool immediateResultValid = false;
        QHostInfo hostInfo = qt_qhostinfo_lookup(lookupHost,
                                                 this->q_func(),
                                                 SLOT(_q_hostLookupFinished(QHostInfo)),
                                                 &immediateResultValid,
                                                 &hostLookupId);
        if (immediateResultValid) {
            _q_hostLookupFinished(hostInfo);
        }
    }
}